

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  void *pvVar2;
  CollSeq *pColl;
  uint uVar3;
  Mem *pMVar4;
  int iVar5;
  ulong uVar6;
  
  pvVar2 = context->pFunc->pUserData;
  pMVar4 = *argv;
  uVar3._0_2_ = pMVar4->flags;
  uVar3._2_1_ = pMVar4->enc;
  uVar3._3_1_ = pMVar4->eSubtype;
  if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
    return;
  }
  if (1 < argc) {
    pColl = context->pVdbe->aOp[(long)context->iOp + -1].p4.pColl;
    iVar5 = 0;
    uVar6 = 1;
    do {
      pMVar4 = argv[uVar6];
      uVar1._0_2_ = pMVar4->flags;
      uVar1._2_1_ = pMVar4->enc;
      uVar1._3_1_ = pMVar4->eSubtype;
      if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
        return;
      }
      uVar3 = sqlite3MemCompare(argv[iVar5],pMVar4,pColl);
      if (-1 < (int)(uVar3 ^ -(uint)(pvVar2 != (void *)0x0))) {
        iVar5 = (int)uVar6;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
    pMVar4 = argv[iVar5];
  }
  sqlite3VdbeMemCopy(context->pOut,pMVar4);
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}